

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O2

error_code __thiscall flowtest::Parser::parse(Parser *this,Report *report)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Message MStack_78;
  
  Lexer::consume(&this->lexer_,InitializerMark);
  while ((this->lexer_).currentToken_ != Eof) {
    parseMessage(&MStack_78,this);
    (*report->_vptr_Report[2])(report,&MStack_78);
    flow::diagnostics::Message::~Message(&MStack_78);
  }
  uVar2 = std::_V2::system_category();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code Parser::parse(flow::diagnostics::Report* report) {
  lexer_.consume(Token::InitializerMark);

  while (!lexer_.eof())
    report->push_back(parseMessage());

  return std::error_code{};
}